

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

void ModulusHelper<signed_char,_signed_char,_0>::
     ModulusThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (char *t,char *u,char *result)

{
  char cVar1;
  
  cVar1 = *u;
  if (cVar1 == -1) {
    cVar1 = '\0';
  }
  else {
    if (cVar1 == '\0') {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
    }
    cVar1 = *t % cVar1;
  }
  *result = cVar1;
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void ModulusThrow( const T& t, const U& u, T& result ) SAFEINT_CPP_THROW
    {
        if(u == 0)
            E::SafeIntOnDivZero();

        //trap corner case
        if (mod_corner_case<U, std::numeric_limits< U >::is_signed >::is_undefined(u))
        {
            result = 0;
            return;
        }

        result = (T)(t % u);
    }